

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::convolveTransitionMatrices
          (BeagleCPUImpl<float,_1,_0> *this,int *firstIndices,int *secondIndices,int *resultIndices,
          int matrixCount)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float **ppfVar4;
  float *pfVar5;
  long lVar6;
  int iVar7;
  float *pfVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int k;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  float *pfVar16;
  int iVar17;
  float *pfVar18;
  float sum;
  undefined1 auVar19 [16];
  
  if (0 < matrixCount) {
    uVar1 = this->kStateCount;
    ppfVar4 = this->gTransitionMatrices;
    iVar2 = this->kCategoryCount;
    iVar7 = this->kTransPaddedStateCount * uVar1;
    uVar12 = 0;
    do {
      iVar3 = resultIndices[uVar12];
      if (firstIndices[uVar12] == iVar3) {
        return -5;
      }
      if (secondIndices[uVar12] == iVar3) {
        return -5;
      }
      if (0 < iVar2) {
        iVar9 = 0;
        iVar17 = 0;
        pfVar5 = ppfVar4[iVar3];
        pfVar8 = ppfVar4[secondIndices[uVar12]];
        pfVar14 = ppfVar4[firstIndices[uVar12]];
        do {
          if (0 < (int)uVar1) {
            uVar11 = 0;
            do {
              iVar3 = this->kTransPaddedStateCount;
              uVar10 = 0;
              lVar6 = (long)iVar17;
              pfVar18 = pfVar8;
              do {
                lVar15 = lVar6;
                auVar19 = ZEXT816(0) << 0x40;
                uVar13 = 0;
                pfVar16 = pfVar18;
                do {
                  lVar6 = (long)(int)uVar11 * (long)iVar3 + uVar13;
                  uVar13 = uVar13 + 1;
                  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)pfVar14[lVar6]),
                                            ZEXT416((uint)*pfVar16));
                  pfVar16 = pfVar16 + iVar3;
                } while (uVar1 != uVar13);
                uVar10 = uVar10 + 1;
                pfVar18 = pfVar18 + 1;
                pfVar5[lVar15] = auVar19._0_4_;
                lVar6 = lVar15 + 1;
              } while (uVar10 != uVar1);
              iVar17 = (int)lVar15 + 2;
              uVar11 = uVar11 + 1;
              pfVar5[(int)(lVar15 + 1)] = 1.0;
            } while (uVar11 != uVar1);
          }
          iVar9 = iVar9 + 1;
          pfVar8 = pfVar8 + iVar7;
          pfVar14 = pfVar14 + iVar7;
        } while (iVar9 != iVar2);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)matrixCount);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::convolveTransitionMatrices(const int* firstIndices,
        const int* secondIndices,
        const int* resultIndices,
        int matrixCount) {

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Entering BeagleCPUImpl::convolveTransitionMatrices \n");
#endif

    int returnCode = BEAGLE_SUCCESS;

    for (int u = 0; u < matrixCount; u++) {

        if(firstIndices[u] == resultIndices[u] || secondIndices[u] == resultIndices[u]) {

#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr, "In-place convolution is not allowed \n");
#endif

            returnCode = BEAGLE_ERROR_OUT_OF_RANGE;
            break;

        }//END: overwrite check

        REALTYPE* C = gTransitionMatrices[resultIndices[u]];
        REALTYPE* A = gTransitionMatrices[firstIndices[u]];
        REALTYPE* B = gTransitionMatrices[secondIndices[u]];

        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {

            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {

                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++) {
                        sum += A[k + kTransPaddedStateCount * i] * B[j + kTransPaddedStateCount * k];
                    }
//                  printf("%.30f %.30f %d: \n", C[n], sum, l);
                    C[n] = sum;
                    n++;

                }//END: j loop

                if (T_PAD != 0) {

                    //                      A[n] = 1.0;
                    //                      B[n] = 1.0;
                    C[n] = 1.0;

                    n += T_PAD;

                }//END: padding check

            }//END: i loop

            A += kStateCount * kTransPaddedStateCount;
            B += kStateCount * kTransPaddedStateCount;

        }//END: rates loop

    }//END: u loop

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Leaving BeagleCPUImpl::convolveTransitionMatrices \n");
#endif

    return returnCode;
}